

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O1

void __thiscall nuraft::asio_rpc_client::~asio_rpc_client(asio_rpc_client *this)

{
  _Atomic_word *p_Var1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  pointer pcVar4;
  int iVar5;
  string local_30;
  
  (this->super_rpc_client)._vptr_rpc_client = (_func_int **)&PTR__asio_rpc_client_005be9c0;
  peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2 != (element_type *)0x0) {
    iVar5 = (**(code **)(*(long *)peVar2 + 0x38))();
    if (5 < iVar5) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_(&local_30,"asio client destroyed: %p",this);
      (**(code **)(*(long *)peVar2 + 0x40))
                (peVar2,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                 ,"~asio_rpc_client",0x3a3,&local_30);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p);
      }
    }
  }
  p_Var3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  asio::detail::
  io_object_impl<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_asio::any_io_executor>
  ::~io_object_impl(&(this->operation_timer_).impl_);
  pcVar4 = (this->port_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != &(this->port_).field_2) {
    operator_delete(pcVar4);
  }
  pcVar4 = (this->host_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != &(this->host_).field_2) {
    operator_delete(pcVar4);
  }
  asio::ssl::detail::stream_core::~stream_core(&(this->ssl_socket_).core_);
  asio::detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
  ~io_object_impl((io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
                   *)&this->socket_);
  asio::detail::io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::any_io_executor>
  ::~io_object_impl(&(this->resolver_).impl_);
  p_Var3 = (this->super_enable_shared_from_this<nuraft::asio_rpc_client>)._M_weak_this.
           super___weak_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var3->_M_weak_count;
      iVar5 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar5 = p_Var3->_M_weak_count;
      p_Var3->_M_weak_count = iVar5 + -1;
    }
    if (iVar5 == 1) {
      (*p_Var3->_vptr__Sp_counted_base[3])();
    }
  }
  return;
}

Assistant:

virtual ~asio_rpc_client() {
        p_tr("asio client destroyed: %p", this);
        close_socket();
    }